

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# downloader-libcurl.cpp
# Opt level: O3

string * __thiscall
Downloader_libcurl::getFileNameFromURL
          (string *__return_storage_ptr__,Downloader_libcurl *this,string *downloadURL)

{
  char cVar1;
  size_t __n;
  pointer pcVar2;
  long *plVar3;
  int iVar4;
  char *pcVar5;
  pointer pcVar6;
  uint uVar7;
  bool bVar8;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  uVar7 = (uint)downloadURL->_M_string_length;
  while (uVar7 = uVar7 - 1, -1 < (int)uVar7) {
    if ((downloadURL->_M_dataplus)._M_p[uVar7 & 0x7fffffff] == '/') {
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
      plVar3 = local_50;
      __n = __return_storage_ptr__->_M_string_length;
      if (__n == local_48) {
        if (__n == 0) {
          bVar8 = false;
        }
        else {
          iVar4 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,local_50,__n);
          bVar8 = iVar4 != 0;
        }
      }
      else {
        bVar8 = true;
      }
      if (plVar3 != local_40) {
        operator_delete(plVar3,local_40[0] + 1);
      }
      if (bVar8) break;
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
  pcVar6 = pcVar2 + (__return_storage_ptr__->_M_string_length - 1);
  if (pcVar2 < pcVar6 && __return_storage_ptr__->_M_string_length != 0) {
    do {
      pcVar5 = pcVar2 + 1;
      cVar1 = *pcVar2;
      *pcVar2 = *pcVar6;
      *pcVar6 = cVar1;
      pcVar6 = pcVar6 + -1;
      pcVar2 = pcVar5;
    } while (pcVar5 < pcVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Downloader_libcurl::getFileNameFromURL(const std::string &downloadURL)
{
    std::string result = std::string("");
    for (int i = downloadURL.length() - 1; i >= 0; i--)
    {
        if (downloadURL[i] == '/' && result != std::string("")) break;
        result += downloadURL[i];
    }
    std::reverse(result.begin(), result.end());
    return result;
}